

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shadow-params.cc
# Opt level: O2

vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *
dynet::allocate_shadow_parameters
          (vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>
           *__return_storage_ptr__,ParameterCollection *m)

{
  pointer ppPVar1;
  ParameterCollectionStorage *pPVar2;
  ParameterStorage **p;
  pointer ppPVar3;
  
  (__return_storage_ptr__->
  super__Vector_base<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar2 = ParameterCollection::get_storage(m);
  std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>::reserve
            (__return_storage_ptr__,
             (long)(pPVar2->params).
                   super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pPVar2->params).
                   super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  pPVar2 = ParameterCollection::get_storage(m);
  ppPVar1 = (pPVar2->params).
            super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar3 = (pPVar2->params).
                 super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppPVar3 != ppPVar1;
      ppPVar3 = ppPVar3 + 1) {
    std::vector<dynet::ShadowParameters,std::allocator<dynet::ShadowParameters>>::
    emplace_back<dynet::ParameterStorage&>
              ((vector<dynet::ShadowParameters,std::allocator<dynet::ShadowParameters>> *)
               __return_storage_ptr__,*ppPVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ShadowParameters> allocate_shadow_parameters(const ParameterCollection& m) {
  vector<ShadowParameters> v;
  v.reserve(m.parameters_list().size());
  for (auto& p : m.parameters_list())
    v.emplace_back(*p);
  return v;
}